

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O2

int arm_current_el(CPUARMState_conflict *env)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = (uint)env->features;
  if ((uVar3 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar2 = env->uncached_cpsr & 0x1f;
      if (uVar2 == 0x10) {
        uVar2 = 0;
      }
      else if (uVar2 == 0x16) {
        uVar2 = 3;
      }
      else if (uVar2 == 0x1a) {
        uVar2 = 2;
      }
      else {
        _Var1 = arm_is_secure(env);
        uVar2 = 1;
        if ((uVar3 >> 0x1c & 1) == 0) {
          uVar2 = _Var1 + 1 + (uint)_Var1;
        }
      }
    }
    else {
      uVar2 = env->pstate >> 2 & 3;
    }
  }
  else if ((env->v7m).exception == 0) {
    uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
  }
  else {
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

static inline int arm_current_el(CPUARMState *env)
{
    if (arm_feature(env, ARM_FEATURE_M)) {
        return arm_v7m_is_handler_mode(env) ||
            !(env->v7m.control[env->v7m.secure] & 1);
    }

    if (is_a64(env)) {
        return extract32(env->pstate, 2, 2);
    }

    switch (env->uncached_cpsr & 0x1f) {
    case ARM_CPU_MODE_USR:
        return 0;
    case ARM_CPU_MODE_HYP:
        return 2;
    case ARM_CPU_MODE_MON:
        return 3;
    default:
        if (arm_is_secure(env) && !arm_el_is_aa64(env, 3)) {
            /* If EL3 is 32-bit then all secure privileged modes run in
             * EL3
             */
            return 3;
        }

        return 1;
    }
}